

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void COVER_tryParameters(void *opaque)

{
  ZDICT_cover_params_t *pZVar1;
  COVER_ctx_t *ctx;
  size_t __size;
  undefined4 uVar2;
  undefined4 uVar3;
  COVER_dictSelection_t selection;
  ZDICT_cover_params_t parameters_00;
  ZDICT_cover_params_t params;
  ZDICT_cover_params_t parameters_01;
  int iVar4;
  void *dictBuffer;
  U32 *freqs;
  size_t sVar5;
  char *__ptr;
  BYTE *__ptr_00;
  size_t sStackY_f0;
  size_t in_stack_ffffffffffffff68;
  ZDICT_cover_params_t parameters;
  COVER_dictSelection_t ds;
  COVER_map_t local_40;
  
  ctx = *opaque;
  pZVar1 = (ZDICT_cover_params_t *)((long)opaque + 0x18);
  uVar2 = pZVar1->k;
  uVar3 = pZVar1->d;
  parameters_01 = *pZVar1;
  params = *pZVar1;
  parameters_00 = *pZVar1;
  __size = *(size_t *)((long)opaque + 0x10);
  dictBuffer = malloc(__size);
  ds.dictContent = (BYTE *)0x0;
  ds.dictSize = 0;
  ds.totalCompressedSize = 0xffffffffffffffff;
  freqs = (U32 *)malloc(ctx->suffixSize << 2);
  iVar4 = COVER_map_init(&local_40,(uVar2 - uVar3) + 1);
  if (iVar4 == 0) {
    if (g_displayLevel < 1) goto LAB_00178dd8;
    __ptr = "Failed to allocate dmer map: out of memory\n";
    sStackY_f0 = 0x2b;
LAB_00178e6e:
    fwrite(__ptr,sStackY_f0,1,_stderr);
    __ptr_00 = (BYTE *)0x0;
  }
  else {
    if ((dictBuffer == (void *)0x0) || (freqs == (U32 *)0x0)) {
      if (0 < g_displayLevel) {
        __ptr = "Failed to allocate buffers: out of memory\n";
        sStackY_f0 = 0x2a;
        goto LAB_00178e6e;
      }
LAB_00178dd8:
      __ptr_00 = (BYTE *)0x0;
      goto LAB_00178ddb;
    }
    memcpy(freqs,ctx->freqs,ctx->suffixSize << 2);
    sVar5 = COVER_buildDictionary(ctx,freqs,&local_40,dictBuffer,__size,parameters_00);
    COVER_selectDict(&ds,(BYTE *)((long)dictBuffer + sVar5),__size,__size - sVar5,ctx->samples,
                     ctx->samplesSizes,(uint)ctx->nbTrainSamples,ctx->nbTrainSamples,ctx->nbSamples,
                     params,ctx->offsets,in_stack_ffffffffffffff68);
    __ptr_00 = ds.dictContent;
    if ((ds.dictContent != (BYTE *)0x0 && ds.totalCompressedSize < 0xffffffffffffff89) ||
       (g_displayLevel < 1)) goto LAB_00178ddb;
    fwrite("Failed to select dictionary\n",0x1c,1,_stderr);
  }
  fflush(_stderr);
LAB_00178ddb:
  free(dictBuffer);
  selection.dictSize = ds.dictSize;
  selection.dictContent = ds.dictContent;
  selection.totalCompressedSize = ds.totalCompressedSize;
  COVER_best_finish(*(COVER_best_t **)((long)opaque + 8),parameters_01,selection);
  free(opaque);
  free(local_40.data);
  free(__ptr_00);
  free(freqs);
  return;
}

Assistant:

static void COVER_tryParameters(void *opaque)
{
  /* Save parameters as local variables */
  COVER_tryParameters_data_t *const data = (COVER_tryParameters_data_t*)opaque;
  const COVER_ctx_t *const ctx = data->ctx;
  const ZDICT_cover_params_t parameters = data->parameters;
  size_t dictBufferCapacity = data->dictBufferCapacity;
  size_t totalCompressedSize = ERROR(GENERIC);
  /* Allocate space for hash table, dict, and freqs */
  COVER_map_t activeDmers;
  BYTE* const dict = (BYTE*)malloc(dictBufferCapacity);
  COVER_dictSelection_t selection = COVER_dictSelectionError(ERROR(GENERIC));
  U32* const freqs = (U32*)malloc(ctx->suffixSize * sizeof(U32));
  if (!COVER_map_init(&activeDmers, parameters.k - parameters.d + 1)) {
    DISPLAYLEVEL(1, "Failed to allocate dmer map: out of memory\n");
    goto _cleanup;
  }
  if (!dict || !freqs) {
    DISPLAYLEVEL(1, "Failed to allocate buffers: out of memory\n");
    goto _cleanup;
  }
  /* Copy the frequencies because we need to modify them */
  memcpy(freqs, ctx->freqs, ctx->suffixSize * sizeof(U32));
  /* Build the dictionary */
  {
    const size_t tail = COVER_buildDictionary(ctx, freqs, &activeDmers, dict,
                                              dictBufferCapacity, parameters);
    selection = COVER_selectDict(dict + tail, dictBufferCapacity, dictBufferCapacity - tail,
        ctx->samples, ctx->samplesSizes, (unsigned)ctx->nbTrainSamples, ctx->nbTrainSamples, ctx->nbSamples, parameters, ctx->offsets,
        totalCompressedSize);

    if (COVER_dictSelectionIsError(selection)) {
      DISPLAYLEVEL(1, "Failed to select dictionary\n");
      goto _cleanup;
    }
  }
_cleanup:
  free(dict);
  COVER_best_finish(data->best, parameters, selection);
  free(data);
  COVER_map_destroy(&activeDmers);
  COVER_dictSelectionFree(selection);
  free(freqs);
}